

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O0

void __thiscall
gui::Signal<gui::Widget_*,_const_sf::String_&>::emit
          (Signal<gui::Widget_*,_const_sf::String_&> *this,Widget *funcArgs,String *funcArgs_1)

{
  bool bVar1;
  Tag TVar2;
  const_iterator this_00;
  Widget *__args;
  function<void_()> *in_RDI;
  pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_> *c;
  const_iterator __end0;
  const_iterator __begin0;
  map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>_>
  *__range2;
  map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_28;
  size_type *local_20;
  
  if (((ulong)(((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&in_RDI->super__Function_base)->_M_dataplus)._M_p & 1) != 0) {
    local_20 = &((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&in_RDI->super__Function_base)->_M_string_length;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>_>
         ::begin(in_stack_ffffffffffffffb8);
    this_00 = std::
              map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>_>
              ::end(in_stack_ffffffffffffffb8);
    while (bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffffd0), bVar1) {
      __args = (Widget *)
               std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>
                            *)in_RDI);
      TVar2 = Callback<gui::Widget_*,_const_sf::String_&>::getTag
                        ((Callback<gui::Widget_*,_const_sf::String_&> *)
                         &__args->super_enable_shared_from_this<gui::Widget>);
      if (TVar2 == withArgs) {
        Callback<gui::Widget*,sf::String_const&>::
        value<(gui::Callback<gui::Widget*,sf::String_const&>::Tag)0,void>
                  ((Callback<gui::Widget*,sf::String_const&> *)
                   &__args->super_enable_shared_from_this<gui::Widget>);
        std::function<void_(gui::Widget_*,_const_sf::String_&)>::operator()
                  ((function<void_(gui::Widget_*,_const_sf::String_&)> *)this_00._M_node,__args,
                   (String *)in_RDI);
      }
      else {
        Callback<gui::Widget*,sf::String_const&>::
        value<(gui::Callback<gui::Widget*,sf::String_const&>::Tag)1,void>
                  ((Callback<gui::Widget*,sf::String_const&> *)
                   &__args->super_enable_shared_from_this<gui::Widget>);
        std::function<void_()>::operator()(in_RDI);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>
                    *)in_RDI);
    }
  }
  return;
}

Assistant:

void emit(Targs... funcArgs) const {
        if (!enabled_) {
            return;
        }
        using Tag = typename Callback<Targs...>::Tag;
        for (const auto& c : callbacks_) {
            if (c.second.getTag() == Tag::withArgs) {
                c.second.template value<Tag::withArgs>()(funcArgs...);
            } else {
                c.second.template value<Tag::noArgs>()();
            }
        }
    }